

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XGLLoader.cpp
# Opt level: O3

void __thiscall Assimp::XGLImporter::ReadLighting(XGLImporter *this,TempScope *scope)

{
  bool bVar1;
  int iVar2;
  aiLight *paVar3;
  string local_50;
  
  bVar1 = ReadElementUpToClosing(this,"lighting");
  if (bVar1) {
    do {
      GetElementName_abi_cxx11_(&local_50,this);
      iVar2 = std::__cxx11::string::compare((char *)&local_50);
      if (iVar2 == 0) {
        paVar3 = ReadDirectionalLight(this);
        scope->light = paVar3;
      }
      else {
        iVar2 = std::__cxx11::string::compare((char *)&local_50);
        if (iVar2 != 0) {
          iVar2 = std::__cxx11::string::compare((char *)&local_50);
          if (iVar2 != 0) goto LAB_005cb058;
        }
        LogFunctions<Assimp::XGLImporter>::LogWarn((char *)0x5cb047);
      }
LAB_005cb058:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      bVar1 = ReadElementUpToClosing(this,"lighting");
    } while (bVar1);
  }
  return;
}

Assistant:

void XGLImporter::ReadLighting(TempScope& scope)
{
    while (ReadElementUpToClosing("lighting"))  {
        const std::string& s = GetElementName();
        if (s == "directionallight") {
            scope.light = ReadDirectionalLight();
        }
        else if (s == "ambient") {
            LogWarn("ignoring <ambient> tag");
        }
        else if (s == "spheremap") {
            LogWarn("ignoring <spheremap> tag");
        }
    }
}